

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int is_uppercase(char *str)

{
  uint uVar1;
  size_t sVar2;
  ushort **ppuVar3;
  size_t sVar4;
  
  if (*str == '\0') {
LAB_00108ecc:
    uVar1 = 0;
  }
  else {
    sVar2 = strlen(str);
    uVar1 = 0;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[str[sVar4]] >> 9 & 1) != 0) goto LAB_00108ecc;
      if (uVar1 == 0) {
        uVar1 = (*ppuVar3)[str[sVar4]] >> 8 & 1;
      }
      else {
        uVar1 = 1;
      }
    }
  }
  return uVar1;
}

Assistant:

static int is_uppercase(const char * str)
{
   size_t c;
   int hasupper = 0;

   if( !str || !*str ) return 0;

   for(c = 0; c < strlen(str); c++ ) {
     if( islower((int) str[c]) ) return 0;
     if( !hasupper && isupper((int) str[c]) ) hasupper = 1;
   }

   return hasupper;
}